

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

Expression * __thiscall
CFG::MultipleShape::Render(MultipleShape *this,RelooperBuilder *Builder,bool InLoop)

{
  _Rb_tree_header *p_Var1;
  pointer ppIVar2;
  Shape *pSVar3;
  int iVar4;
  Binary *pBVar5;
  Expression *pEVar6;
  If *this_00;
  _Base_ptr p_Var7;
  Block *pBVar8;
  undefined4 extraout_var;
  If *this_01;
  If *local_68;
  If *Now;
  pointer ppIStack_58;
  vector<wasm::If_*,_std::allocator<wasm::If_*>_> finalizeStack;
  
  ppIStack_58 = (pointer)0x0;
  finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var7 = (this->InnerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->InnerMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    Now = (If *)0x0;
  }
  else {
    Now = (If *)0x0;
    this_01 = (If *)0x0;
    do {
      pBVar5 = RelooperBuilder::makeCheckLabel(Builder,p_Var7[1]._M_color);
      pEVar6 = (Expression *)
               (**(code **)(*(long *)p_Var7[1]._M_parent + 0x10))
                         (p_Var7[1]._M_parent,Builder,(uint)InLoop);
      this_00 = (If *)MixedArena::allocSpace(&((Builder->super_Builder).wasm)->allocator,0x28,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
      this_00->ifFalse = (Expression *)0x0;
      this_00->condition = (Expression *)pBVar5;
      this_00->ifTrue = pEVar6;
      ::wasm::If::finalize(this_00);
      local_68 = this_00;
      if (finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::If*,std::allocator<wasm::If*>>::_M_realloc_insert<wasm::If*const&>
                  ((vector<wasm::If*,std::allocator<wasm::If*>> *)&ppIStack_58,
                   (iterator)
                   finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl
                   .super__Vector_impl_data._M_start,&local_68);
      }
      else {
        *finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
         super__Vector_impl_data._M_start = this_00;
        finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      if (this_01 == (If *)0x0) {
        Now = local_68;
      }
      else {
        this_01->ifFalse = (Expression *)local_68;
        ::wasm::If::finalize(this_01);
      }
      this_01 = local_68;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  while (finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
         super__Vector_impl_data._M_start != ppIStack_58) {
    ppIVar2 = finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
              super__Vector_impl_data._M_start + -1;
    finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
         super__Vector_impl_data._M_start + -1;
    ::wasm::If::finalize(*ppIVar2);
  }
  pBVar8 = ::wasm::Builder::makeBlock(&Builder->super_Builder,(Expression *)Now);
  pBVar8 = (Block *)HandleFollowupMultiples((Expression *)pBVar8,&this->super_Shape,Builder,InLoop);
  pSVar3 = (this->super_Shape).Next;
  if (pSVar3 != (Shape *)0x0) {
    iVar4 = (*pSVar3->_vptr_Shape[2])(pSVar3,Builder,(ulong)(uint)InLoop);
    pBVar8 = ::wasm::Builder::makeBlock(&Builder->super_Builder,(Expression *)pBVar8);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar8->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)CONCAT44(extraout_var,iVar4));
    ::wasm::Block::finalize(pBVar8);
  }
  if (ppIStack_58 != (pointer)0x0) {
    operator_delete(ppIStack_58,
                    (long)finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppIStack_58);
  }
  return (Expression *)pBVar8;
}

Assistant:

wasm::Expression* MultipleShape::Render(RelooperBuilder& Builder, bool InLoop) {
  // TODO: consider switch
  // emit an if-else chain
  wasm::If* FirstIf = nullptr;
  wasm::If* CurrIf = nullptr;
  std::vector<wasm::If*> finalizeStack;
  for (auto& [Id, Body] : InnerMap) {
    auto* Now =
      Builder.makeIf(Builder.makeCheckLabel(Id), Body->Render(Builder, InLoop));
    finalizeStack.push_back(Now);
    if (!CurrIf) {
      FirstIf = CurrIf = Now;
    } else {
      CurrIf->ifFalse = Now;
      CurrIf->finalize();
      CurrIf = Now;
    }
  }
  while (finalizeStack.size() > 0) {
    wasm::If* curr = finalizeStack.back();
    finalizeStack.pop_back();
    curr->finalize();
  }
  wasm::Expression* Ret = Builder.makeBlock(FirstIf);
  Ret = HandleFollowupMultiples(Ret, this, Builder, InLoop);
  if (Next) {
    Ret = Builder.makeSequence(Ret, Next->Render(Builder, InLoop));
  }
  return Ret;
}